

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void clearSelect(sqlite3 *db,Select *p,int bFree)

{
  Select *pSVar1;
  Window *pWVar2;
  Window *p_00;
  bool bVar3;
  
  if (p != (Select *)0x0) {
    bVar3 = bFree == 0;
    do {
      pSVar1 = p->pPrior;
      if (p->pEList != (ExprList *)0x0) {
        exprListDeleteNN(db,p->pEList);
      }
      sqlite3SrcListDelete(db,p->pSrc);
      if (p->pWhere != (Expr *)0x0) {
        sqlite3ExprDeleteNN(db,p->pWhere);
      }
      if (p->pGroupBy != (ExprList *)0x0) {
        exprListDeleteNN(db,p->pGroupBy);
      }
      if (p->pHaving != (Expr *)0x0) {
        sqlite3ExprDeleteNN(db,p->pHaving);
      }
      if (p->pOrderBy != (ExprList *)0x0) {
        exprListDeleteNN(db,p->pOrderBy);
      }
      if (p->pLimit != (Expr *)0x0) {
        sqlite3ExprDeleteNN(db,p->pLimit);
      }
      p_00 = p->pWinDefn;
      while (p_00 != (Window *)0x0) {
        pWVar2 = p_00->pNextWin;
        sqlite3WindowDelete(db,p_00);
        p_00 = pWVar2;
      }
      if (p->pWith != (With *)0x0) {
        sqlite3WithDelete(db,p->pWith);
      }
      if (!bVar3) {
        sqlite3DbFreeNN(db,p);
      }
      bVar3 = false;
      p = pSVar1;
    } while (pSVar1 != (Select *)0x0);
  }
  return;
}

Assistant:

static void clearSelect(sqlite3 *db, Select *p, int bFree){
  while( p ){
    Select *pPrior = p->pPrior;
    sqlite3ExprListDelete(db, p->pEList);
    sqlite3SrcListDelete(db, p->pSrc);
    sqlite3ExprDelete(db, p->pWhere);
    sqlite3ExprListDelete(db, p->pGroupBy);
    sqlite3ExprDelete(db, p->pHaving);
    sqlite3ExprListDelete(db, p->pOrderBy);
    sqlite3ExprDelete(db, p->pLimit);
#ifndef SQLITE_OMIT_WINDOWFUNC
    if( OK_IF_ALWAYS_TRUE(p->pWinDefn) ){
      sqlite3WindowListDelete(db, p->pWinDefn);
    }
#endif
    if( OK_IF_ALWAYS_TRUE(p->pWith) ) sqlite3WithDelete(db, p->pWith);
    if( bFree ) sqlite3DbFreeNN(db, p);
    p = pPrior;
    bFree = 1;
  }
}